

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.h
# Opt level: O2

void __thiscall embree::BVHN<4>::cleanup(BVHN<4> *this,EVP_PKEY_CTX *ctx)

{
  pointer ppTVar1;
  pointer ppTVar2;
  
  FastAllocator::internal_fix_used_blocks(&this->alloc);
  ppTVar1 = (this->alloc).thread_local_allocators.
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar2 = (this->alloc).thread_local_allocators.
                 super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppTVar2 != ppTVar1;
      ppTVar2 = ppTVar2 + 1) {
    FastAllocator::ThreadLocal2::unbind(*ppTVar2,&this->alloc);
  }
  ppTVar2 = (this->alloc).thread_local_allocators.
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->alloc).thread_local_allocators.
      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar2) {
    (this->alloc).thread_local_allocators.
    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppTVar2;
  }
  return;
}

Assistant:

void cleanup() {
      alloc.cleanup();
    }